

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exrmetrics.cpp
# Opt level: O2

partSizeData *
initAndReadDeepTiled
          (partSizeData *__return_storage_ptr__,vector<int,_std::allocator<int>_> *sampleCount,
          vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
          *sampleData,
          vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
          *pixelPtrs,DeepFrameBuffer *buf,DeepTiledInputPart *in,
          vector<int,_std::allocator<int>_> *inputSampleCount,Header *outHeader,
          vector<double,_std::allocator<double>_> *countPerf,
          vector<double,_std::allocator<double>_> *samplePerf)

{
  vector<int,_std::allocator<int>_> *pvVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  int *piVar6;
  Header *h;
  _Rb_tree_node_base *p_Var7;
  _Rb_tree_node_base *p_Var8;
  runtime_error *this;
  long lVar9;
  long lVar10;
  size_type __new_size;
  size_type __new_size_00;
  vector<int,_std::allocator<int>_> *__range1;
  _Rb_tree_node_base *local_b8;
  int local_ac;
  long local_98;
  double local_68 [7];
  
  Imf_3_4::DeepTiledInputPart::header();
  lVar5 = Imf_3_4::Header::tileDescription();
  if (*(int *)(lVar5 + 8) == 2) {
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"exrmetrics does not support ripmapped deep tiled parts")
    ;
  }
  else {
    if (*(int *)(lVar5 + 8) != 1) {
      Imf_3_4::DeepTiledInputPart::header();
      piVar6 = (int *)Imf_3_4::Header::dataWindow();
      iVar3 = *piVar6;
      iVar4 = piVar6[1];
      lVar5 = (long)((piVar6[2] - iVar3) + 1);
      __new_size_00 = ((piVar6[3] - iVar4) + 1) * lVar5;
      h = (Header *)Imf_3_4::DeepTiledInputPart::header();
      iVar2 = channelCount(h);
      lVar10 = iVar4 * lVar5 + (long)iVar3;
      __new_size = (size_type)iVar2;
      std::
      vector<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
      ::resize(pixelPtrs,__new_size);
      std::vector<int,_std::allocator<int>_>::resize(sampleCount,__new_size_00);
      local_98 = 0;
      Imf_3_4::Slice::Slice
                ((Slice *)local_68,UINT,
                 (char *)((sampleCount->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start + -lVar10),4,lVar5 * 4,1,1,0.0,false,
                 false);
      Imf_3_4::DeepFrameBuffer::insertSampleCountSlice((Slice *)buf);
      Imf_3_4::Header::channels();
      local_b8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      local_ac = 0;
      while( true ) {
        Imf_3_4::Header::channels();
        p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        if (local_b8 == p_Var7) break;
        std::vector<char_*,_std::allocator<char_*>_>::resize
                  ((vector<char_*,_std::allocator<char_*>_> *)
                   ((long)&(((pixelPtrs->
                             super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                             )._M_impl.super__Vector_impl_data._M_start)->
                           super__Vector_base<char_*,_std::allocator<char_*>_>)._M_impl.
                           super__Vector_impl_data + local_98),__new_size_00);
        iVar3 = Imf_3_4::pixelTypeSize(local_b8[9]._M_color);
        Imf_3_4::DeepSlice::DeepSlice
                  ((DeepSlice *)local_68,local_b8[9]._M_color,
                   (char *)(*(long *)((long)&(((pixelPtrs->
                                               super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                                               )._M_impl.super__Vector_impl_data._M_start)->
                                             super__Vector_base<char_*,_std::allocator<char_*>_>).
                                             _M_impl.super__Vector_impl_data + local_98) +
                           lVar10 * -8),8,lVar5 << 3,(long)iVar3,1,1,0.0,false,false);
        Imf_3_4::DeepFrameBuffer::insert((char *)buf,(DeepSlice *)(local_b8 + 1));
        local_ac = iVar3 + local_ac;
        local_b8 = (_Rb_tree_node_base *)std::_Rb_tree_increment(local_b8);
        local_98 = local_98 + 0x18;
      }
      iVar3 = (int)in;
      pvVar1 = inputSampleCount;
      if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
        Imf_3_4::DeepTiledInputPart::setFrameBuffer((DeepFrameBuffer *)in);
        lVar5 = std::chrono::_V2::steady_clock::now();
        iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar3);
        iVar2 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar3);
        Imf_3_4::DeepTiledInputPart::readPixelSampleCounts(iVar3,0,iVar4 + -1,0,iVar2 + -1,0);
        lVar10 = std::chrono::_V2::steady_clock::now();
        local_68[0] = (double)(lVar10 - lVar5) / 1000000000.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(countPerf,local_68);
        pvVar1 = sampleCount;
      }
      lVar5 = 0;
      for (piVar6 = (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_start;
          piVar6 != (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                    super__Vector_impl_data._M_finish; piVar6 = piVar6 + 1) {
        lVar5 = lVar5 + *piVar6;
      }
      std::
      vector<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
      ::resize(sampleData,__new_size);
      Imf_3_4::DeepTiledInputPart::header();
      Imf_3_4::Header::channels();
      p_Var7 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::begin();
      lVar10 = 0;
      while( true ) {
        Imf_3_4::DeepTiledInputPart::header();
        Imf_3_4::Header::channels();
        p_Var8 = (_Rb_tree_node_base *)Imf_3_4::ChannelList::end();
        if (p_Var7 == p_Var8) break;
        iVar4 = Imf_3_4::pixelTypeSize(p_Var7[9]._M_color);
        std::vector<char,_std::allocator<char>_>::resize
                  ((sampleData->
                   super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                   )._M_impl.super__Vector_impl_data._M_start + lVar10,iVar4 * lVar5);
        iVar2 = 0;
        for (lVar9 = 0; __new_size_00 - lVar9 != 0; lVar9 = lVar9 + 1) {
          *(long *)(*(long *)&(pixelPtrs->
                              super__Vector_base<std::vector<char_*,_std::allocator<char_*>_>,_std::allocator<std::vector<char_*,_std::allocator<char_*>_>_>_>
                              )._M_impl.super__Vector_impl_data._M_start[lVar10].
                              super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                              super__Vector_impl_data + lVar9 * 8) =
               (long)(iVar2 * iVar4) +
               *(long *)&(sampleData->
                         super__Vector_base<std::vector<char,_std::allocator<char>_>,_std::allocator<std::vector<char,_std::allocator<char>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start[lVar10].
                         super__Vector_base<char,_std::allocator<char>_>._M_impl.
                         super__Vector_impl_data;
          iVar2 = iVar2 + (pvVar1->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                          super__Vector_impl_data._M_start[lVar9];
        }
        lVar10 = lVar10 + 1;
        p_Var7 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var7);
      }
      if (inputSampleCount == (vector<int,_std::allocator<int>_> *)0x0) {
        lVar10 = std::chrono::_V2::steady_clock::now();
        iVar4 = Imf_3_4::DeepTiledInputPart::numXTiles(iVar3);
        iVar2 = Imf_3_4::DeepTiledInputPart::numYTiles(iVar3);
        Imf_3_4::DeepTiledInputPart::readTiles(iVar3,0,iVar4 + -1,0,iVar2 + -1,0);
        lVar9 = std::chrono::_V2::steady_clock::now();
        local_68[0] = (double)(lVar9 - lVar10) / 1000000000.0;
        std::vector<double,_std::allocator<double>_>::emplace_back<double>(samplePerf,local_68);
      }
      partSizeData::partSizeData(__return_storage_ptr__);
      __return_storage_ptr__->rawSize = lVar5 * local_ac + __new_size_00 * 4;
      __return_storage_ptr__->pixelCount = __new_size_00;
      __return_storage_ptr__->isDeep = true;
      __return_storage_ptr__->isTiled = true;
      __return_storage_ptr__->channelCount = __new_size;
      return __return_storage_ptr__;
    }
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::runtime_error::runtime_error(this,"exrmetrics does not support mipmapped deep tiled parts")
    ;
  }
  __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

partSizeData
initAndReadDeepTiled (
    vector<int>&           sampleCount,
    vector<vector<char>>&  sampleData,
    vector<vector<char*>>& pixelPtrs,
    DeepFrameBuffer&       buf,
    DeepTiledInputPart&    in,
    const vector<int>*     inputSampleCount,
    const Header&          outHeader,
    vector<double>&        countPerf,
    vector<double>&        samplePerf)
{

    TileDescription tiling = in.header ().tileDescription ();

    if (tiling.mode == MIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support mipmapped deep tiled parts");
    }

    if (tiling.mode == RIPMAP_LEVELS)
    {
        throw runtime_error (
            "exrmetrics does not support ripmapped deep tiled parts");
    }

    Box2i    dw        = in.header ().dataWindow ();
    uint64_t width     = dw.max.x + 1 - dw.min.x;
    uint64_t height    = dw.max.y + 1 - dw.min.y;
    uint64_t numPixels = width * height;
    int      numChans  = channelCount (in.header ());

    uint64_t offsetToOrigin = width * static_cast<uint64_t> (dw.min.y) +
                              static_cast<uint64_t> (dw.min.x);

    pixelPtrs.resize (numChans);
    sampleCount.resize (numPixels);

    buf.insertSampleCountSlice (Slice (
        UINT,
        (char*) (sampleCount.data () - offsetToOrigin),
        sizeof (int),
        sizeof (int) * width));
    int channelNumber  = 0;
    int bytesPerSample = 0;

    for (ChannelList::ConstIterator i = outHeader.channels ().begin ();
         i != outHeader.channels ().end ();
         ++i)
    {
        pixelPtrs[channelNumber].resize (numPixels);
        int samplesize = pixelTypeSize (i.channel ().type);
        buf.insert (
            i.name (),
            DeepSlice (
                i.channel ().type,
                (char*) (pixelPtrs[channelNumber].data () - offsetToOrigin),
                sizeof (char*),
                sizeof (char*) * width,
                samplesize));
        ++channelNumber;
        bytesPerSample += samplesize;
    }

    const vector<int>& samples = inputSampleCount ? *inputSampleCount
                                                  : sampleCount;

    if (!inputSampleCount)
    {
        in.setFrameBuffer (buf);

        steady_clock::time_point startCountRead = steady_clock::now ();

        in.readPixelSampleCounts (
            0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endCountRead = steady_clock::now ();

        countPerf.push_back (timing (startCountRead, endCountRead));
    }
    size_t totalSamples = 0;

    for (int i: samples)
    {
        totalSamples += i;
    }

    sampleData.resize (numChans);
    channelNumber = 0;

    for (ChannelList::ConstIterator i = in.header ().channels ().begin ();
         i != in.header ().channels ().end ();
         ++i)
    {
        int samplesize = pixelTypeSize (i.channel ().type);
        sampleData[channelNumber].resize (samplesize * totalSamples);
        int offset = 0;
        for (uint64_t p = 0; p < numPixels; ++p)
        {
            pixelPtrs[channelNumber][p] =
                sampleData[channelNumber].data () + offset * samplesize;
            offset += samples[p];
        }

        ++channelNumber;
    }

    if (!inputSampleCount)
    {
        steady_clock::time_point startSampleRead = steady_clock::now ();
        in.readTiles (0, in.numXTiles (0) - 1, 0, in.numYTiles (0) - 1, 0, 0);
        steady_clock::time_point endSampleRead = steady_clock::now ();

        samplePerf.push_back (timing (startSampleRead, endSampleRead));
    }

    partSizeData data;
    data.rawSize    = totalSamples * bytesPerSample + numPixels * sizeof (int);
    data.pixelCount = numPixels;
    data.isDeep     = true;
    data.isTiled    = true;
    data.channelCount = numChans;
    return data;
}